

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

QWidgetList *
QWidgetPrivate::takeFromFocusChain
          (QWidgetList *__return_storage_ptr__,QWidget *from,QWidget *to,FocusDirection direction)

{
  QWidget *pQVar1;
  QWidget *pQVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  QDebug *pQVar7;
  QWidget **ppQVar8;
  QWidgetData *pQVar9;
  long in_FS_OFFSET;
  initializer_list<QWidget_*> args;
  undefined1 auStack_a8 [24];
  undefined1 local_90 [8];
  Stream *local_88;
  undefined1 local_80 [8];
  QArrayDataPointer<QWidget_*> local_78;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined8 uStack_4c;
  undefined4 local_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
  focusPath((QWidgetList *)&local_78,from,to,direction);
  pQVar9 = (QWidgetData *)local_78.size;
  ppQVar8 = local_78.ptr;
  if ((QWidgetData *)local_78.size == (QWidgetData *)0x0) {
    lcWidgetFocus();
    if (((byte)lcWidgetFocus::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_58 = 2;
      uStack_54 = 0;
      uStack_50 = 0;
      uStack_4c = 0;
      local_44 = 0;
      local_40 = lcWidgetFocus::category.name;
      QMessageLogger::debug();
      pQVar7 = QDebug::operator<<((QDebug *)(auStack_a8 + 8),"No-op removal. Focus chain from");
      auStack_a8._16_8_ = pQVar7->stream;
      *(int *)(auStack_a8._16_8_ + 0x28) = *(int *)(auStack_a8._16_8_ + 0x28) + 1;
      ::operator<<((Stream *)local_90,(QWidget *)(auStack_a8 + 0x10));
      pQVar7 = QDebug::operator<<((QDebug *)local_90,"doesn\'t lead to ");
      local_88 = pQVar7->stream;
      *(int *)(local_88 + 0x28) = *(int *)(local_88 + 0x28) + 1;
      ::operator<<((Stream *)local_80,(QWidget *)&local_88);
      QDebug::~QDebug((QDebug *)local_80);
      QDebug::~QDebug((QDebug *)&local_88);
      QDebug::~QDebug((QDebug *)local_90);
      QDebug::~QDebug((QDebug *)(auStack_a8 + 0x10));
      QDebug::~QDebug((QDebug *)(auStack_a8 + 8));
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QWidget **)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    pQVar1 = *local_78.ptr;
    pQVar2 = local_78.ptr
             [(long)((long)&(((QWidgetData *)(local_78.size + -0x58))->wrect).y2.m_i + 3)];
    if (pQVar1 == pQVar2) {
      removeFromFocusChain(*(QWidgetPrivate **)&pQVar1->field_0x8,(FocusChainRemovalRules)0x0,Next);
      local_58 = SUB84(pQVar1,0);
      uStack_54 = (undefined4)((ulong)pQVar1 >> 0x20);
      args._M_len = 1;
      args._M_array = (iterator)&local_58;
      QList<QWidget_*>::QList(__return_storage_ptr__,args);
    }
    else {
      lVar3 = *(long *)&pQVar2->field_0x8;
      lVar4 = *(long *)(lVar3 + 0x80);
      lVar5 = *(long *)&pQVar1->field_0x8;
      lVar6 = *(long *)(lVar5 + 0x88);
      *(long *)(*(long *)(lVar6 + 8) + 0x80) = lVar4;
      *(long *)(*(long *)(lVar4 + 8) + 0x88) = lVar6;
      *(QWidget **)(lVar5 + 0x88) = pQVar2;
      *(QWidget **)(lVar3 + 0x80) = pQVar1;
      lcWidgetFocus();
      if (((byte)lcWidgetFocus::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
      {
        local_58 = 2;
        uStack_54 = 0;
        uStack_50 = 0;
        uStack_4c = 0;
        local_44 = 0;
        local_40 = lcWidgetFocus::category.name;
        QMessageLogger::debug();
        ::operator<<((Stream *)local_90,(QList<QWidget_*> *)auStack_a8);
        QDebug::operator<<((QDebug *)local_90,"removed from focus chain");
        QDebug::~QDebug((QDebug *)local_90);
        QDebug::~QDebug((QDebug *)auStack_a8);
        ppQVar8 = local_78.ptr;
        pQVar9 = (QWidgetData *)local_78.size;
      }
      (__return_storage_ptr__->d).d = local_78.d;
      (__return_storage_ptr__->d).ptr = ppQVar8;
      (__return_storage_ptr__->d).size = (qsizetype)pQVar9;
      if (local_78.d != (Data *)0x0) {
        LOCK();
        ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
  }
  QArrayDataPointer<QWidget_*>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QWidgetList QWidgetPrivate::takeFromFocusChain(QWidget *from,
                                               QWidget *to,
                                               FocusDirection direction)
{
    // Check if there is a path from->to in direction
    const QWidgetList path = focusPath(from, to , direction);
    if (path.isEmpty()) {
        qCDebug(lcWidgetFocus) << "No-op removal. Focus chain from" << from << "doesn't lead to " << to;
        return QWidgetList();
    }

    QWidget *first = path.constFirst();
    QWidget *last = path.constLast();
    if (first == last) {
        first->d_func()->removeFromFocusChain();
        return QWidgetList({first});
    }

    FOCUS_NEXT(FOCUS_PREV(first)) = FOCUS_NEXT(last);
    FOCUS_PREV(FOCUS_NEXT(last)) = FOCUS_PREV(first);
    FOCUS_PREV(first) = last;
    FOCUS_NEXT(last) = first;
    qCDebug(lcWidgetFocus) << path << "removed from focus chain";
    return path;
}